

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memtable.cc
# Opt level: O2

void __thiscall leveldb::MemTableIterator::Seek(MemTableIterator *this,Slice *k)

{
  pointer local_28;
  
  (this->tmp_)._M_string_length = 0;
  *(this->tmp_)._M_dataplus._M_p = '\0';
  PutVarint32(&this->tmp_,(uint32_t)k->size_);
  std::__cxx11::string::append((char *)&this->tmp_,(ulong)k->data_);
  local_28 = (this->tmp_)._M_dataplus._M_p;
  SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::Iterator::Seek(&this->iter_,&local_28);
  return;
}

Assistant:

void Seek(const Slice& k) override { iter_.Seek(EncodeKey(&tmp_, k)); }